

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeObj(SPxLPBase<double> *this,VectorBase<double> *newObj,bool scale)

{
  SPxSense SVar1;
  undefined1 in_DL;
  VectorBase<double> *in_RSI;
  SPxLPBase<double> *in_RDI;
  undefined4 uVar2;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar3;
  
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  (*(in_RDI->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x26])
            (in_RDI,in_RSI,(ulong)(byte)(uVar3 >> 0x18));
  SVar1 = spxSense(in_RDI);
  if (SVar1 == MINIMIZE) {
    uVar2 = 0xffffffff;
    LPColSetBase<double>::maxObj_w(&in_RDI->super_LPColSetBase<double>);
    VectorBase<double>::operator*=(in_RSI,(int *)CONCAT44(uVar3,uVar2));
  }
  return;
}

Assistant:

virtual void changeObj(const VectorBase<R>& newObj, bool scale = false)
   {
      changeMaxObj(newObj, scale);

      if(spxSense() == MINIMIZE)
         LPColSetBase<R>::maxObj_w() *= -1;
   }